

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

void __thiscall SAT::checkConflict(SAT *this)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  Clause *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  pCVar4 = this->confl;
  if (0xff < *(uint *)pCVar4) {
    uVar5 = (ulong)(*(uint *)pCVar4 >> 8);
    uVar6 = 0;
    do {
      if (uVar5 <= uVar6) {
        abort();
      }
      uVar2 = pCVar4->data[uVar6].x;
      cVar1 = (this->assigns).data[(uint)((int)uVar2 >> 1)];
      cVar3 = -cVar1;
      if ((uVar2 & 1) == 0) {
        cVar3 = cVar1;
      }
      if (cVar3 != ::l_False.value) {
        printf("Analyze: %dth lit is not false\n",uVar6 & 0xffffffff);
      }
      uVar6 = uVar6 + 1;
      pCVar4 = this->confl;
      uVar5 = (ulong)(*(uint *)pCVar4 >> 8);
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void SAT::checkConflict() const {
	assert(confl != nullptr);
	for (unsigned int i = 0; i < confl->size(); i++) {
		if (value((*confl)[i]) != l_False) {
			printf("Analyze: %dth lit is not false\n", i);
		}
		assert(value((*confl)[i]) == l_False);
	}

	/*
		printf("Clause %d\n", learnts.size());
		printf("Conflict clause: ");
		printClause(*confl);
	*/
}